

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O0

void google::protobuf::File::DeleteRecursively(string *name,void *dummy1,void *dummy2)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  DIR *__dirp;
  AlphaNum *in_R8;
  AlphaNum local_1a8;
  AlphaNum local_178;
  AlphaNum local_148;
  string local_118;
  allocator<char> local_e1;
  undefined1 local_e0 [8];
  string entry_name;
  dirent *entry;
  DIR *dir;
  stat stats;
  void *dummy2_local;
  void *dummy1_local;
  string *name_local;
  
  stats.__glibc_reserved[2] = (__syscall_slong_t)dummy2;
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    iVar2 = lstat(pcVar4,(stat *)&dir);
    if (iVar2 == 0) {
      if (((uint)stats.st_nlink & 0xf000) == 0x4000) {
        pcVar4 = (char *)std::__cxx11::string::c_str();
        __dirp = opendir(pcVar4);
        if (__dirp != (DIR *)0x0) {
          while (entry_name.field_2._8_8_ = readdir(__dirp),
                (dirent *)entry_name.field_2._8_8_ != (dirent *)0x0) {
            pcVar4 = ((dirent *)entry_name.field_2._8_8_)->d_name;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)local_e0,pcVar4,&local_e1);
            std::allocator<char>::~allocator(&local_e1);
            bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_e0,".");
            if ((bVar1) &&
               (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_e0,".."), bVar1)) {
              absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_148,name);
              absl::lts_20250127::AlphaNum::AlphaNum(&local_178,"/");
              absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                        (&local_1a8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_e0);
              absl::lts_20250127::StrCat_abi_cxx11_
                        (&local_118,(lts_20250127 *)&local_148,&local_178,&local_1a8,in_R8);
              DeleteRecursively(&local_118,(void *)0x0,(void *)0x0);
              std::__cxx11::string::~string((string *)&local_118);
            }
            std::__cxx11::string::~string((string *)local_e0);
          }
          entry_name.field_2._8_8_ = 0;
        }
        closedir(__dirp);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        rmdir(pcVar4);
      }
      else if (((uint)stats.st_nlink & 0xf000) == 0x8000) {
        pcVar4 = (char *)std::__cxx11::string::c_str();
        remove(pcVar4);
      }
    }
  }
  return;
}

Assistant:

void File::DeleteRecursively(const std::string& name, void* dummy1,
                             void* dummy2) {
  if (name.empty()) return;

  // We don't care too much about error checking here since this is only used
  // in tests to delete temporary directories that are under /tmp anyway.

#ifdef _MSC_VER
  // This interface is so weird.
  WIN32_FIND_DATAA find_data;
  HANDLE find_handle =
      FindFirstFileA(absl::StrCat(name, "/*").c_str(), &find_data);
  if (find_handle == INVALID_HANDLE_VALUE) {
    // Just delete it, whatever it is.
    DeleteFileA(name.c_str());
    RemoveDirectoryA(name.c_str());
    return;
  }

  do {
    std::string entry_name = find_data.cFileName;
    if (entry_name != "." && entry_name != "..") {
      std::string path = absl::StrCat(name, "/", entry_name);
      if (find_data.dwFileAttributes & FILE_ATTRIBUTE_DIRECTORY) {
        DeleteRecursively(path, NULL, NULL);
        RemoveDirectoryA(path.c_str());
      } else {
        DeleteFileA(path.c_str());
      }
    }
  } while(FindNextFileA(find_handle, &find_data));
  FindClose(find_handle);

  RemoveDirectoryA(name.c_str());
#else
  // Use opendir()!  Yay!
  // lstat = Don't follow symbolic links.
  struct stat stats;
  if (lstat(name.c_str(), &stats) != 0) return;

  if (S_ISDIR(stats.st_mode)) {
    DIR* dir = opendir(name.c_str());
    if (dir != NULL) {
      while (true) {
        struct dirent* entry = readdir(dir);
        if (entry == NULL) break;
        std::string entry_name = entry->d_name;
        if (entry_name != "." && entry_name != "..") {
          DeleteRecursively(absl::StrCat(name, "/", entry_name), NULL, NULL);
        }
      }
    }

    closedir(dir);
    rmdir(name.c_str());

  } else if (S_ISREG(stats.st_mode)) {
    remove(name.c_str());
  }
#endif
}